

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TopLevelASBase.hpp
# Opt level: O1

void __thiscall
Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::CopyInstanceData
          (TopLevelASBase<Diligent::EngineVkImplTraits> *this,
          TopLevelASBase<Diligent::EngineVkImplTraits> *Src)

{
  StringPool *this_00;
  Uint32 UVar1;
  HIT_GROUP_BINDING_MODE HVar2;
  undefined3 uVar3;
  Uint32 UVar4;
  IMemoryAllocator *Allocator;
  size_t sVar5;
  char (*in_RCX) [43];
  _Hash_node_base *p_Var6;
  char *NameCopy;
  string local_48;
  
  ClearInstanceData(this);
  sVar5 = (Src->m_StringPool).m_ReservedSize;
  Allocator = GetRawAllocator();
  this_00 = &this->m_StringPool;
  StringPool::Reserve(this_00,sVar5,Allocator);
  (this->m_BuildInfo).LastContributionToHitGroupIndex =
       (Src->m_BuildInfo).LastContributionToHitGroupIndex;
  UVar1 = (Src->m_BuildInfo).HitGroupStride;
  HVar2 = (Src->m_BuildInfo).BindingMode;
  uVar3 = *(undefined3 *)&(Src->m_BuildInfo).field_0x9;
  UVar4 = (Src->m_BuildInfo).FirstContributionToHitGroupIndex;
  (this->m_BuildInfo).InstanceCount = (Src->m_BuildInfo).InstanceCount;
  (this->m_BuildInfo).HitGroupStride = UVar1;
  (this->m_BuildInfo).BindingMode = HVar2;
  *(undefined3 *)&(this->m_BuildInfo).field_0x9 = uVar3;
  (this->m_BuildInfo).FirstContributionToHitGroupIndex = UVar4;
  p_Var6 = (Src->m_Instances)._M_h._M_before_begin._M_nxt;
  if (p_Var6 != (_Hash_node_base *)0x0) {
    do {
      local_48._M_dataplus._M_p = StringPool::CopyString(this_00,(char *)p_Var6[1]._M_nxt);
      std::
      _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::
      _M_emplace<char_const*&,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc_const&>
                ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>,std::allocator<std::pair<Diligent::HashMapStringKey_const,Diligent::TopLevelASBase<Diligent::EngineVkImplTraits>::InstanceDesc>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->m_Instances,&local_48,p_Var6 + 3);
      p_Var6 = p_Var6->_M_nxt;
    } while (p_Var6 != (_Hash_node_base *)0x0);
  }
  sVar5 = StringPool::GetRemainingSize(this_00);
  if (sVar5 != 0) {
    FormatString<char[26],char[43]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"this->m_StringPool.GetRemainingSize() == 0",in_RCX);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"CopyInstanceData",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/TopLevelASBase.hpp"
               ,0xec);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  LOCK();
  (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i =
       (this->m_DvpVersion).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  return;
}

Assistant:

void CopyInstanceData(const TopLevelASBase& Src) noexcept
    {
        ClearInstanceData();

        this->m_StringPool.Reserve(Src.m_StringPool.GetReservedSize(), GetRawAllocator());
        this->m_BuildInfo = Src.m_BuildInfo;

        for (auto& SrcInst : Src.m_Instances)
        {
            const char* NameCopy = this->m_StringPool.CopyString(SrcInst.first.GetStr());
            this->m_Instances.emplace(NameCopy, SrcInst.second);
        }

        VERIFY_EXPR(this->m_StringPool.GetRemainingSize() == 0);

#ifdef DILIGENT_DEVELOPMENT
        this->m_DvpVersion.fetch_add(1);
#endif
    }